

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O1

void pzshape::TPZShapePrism::ShapeInternal
               (TPZVec<double> *x,int order,TPZFMatrix<double> *phi,TPZFMatrix<double> *dphi)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  int j;
  uint uVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int iVar9;
  TPZFNMatrix<20,_double> phi2;
  TPZFNMatrix<20,_double> phi1;
  TPZFNMatrix<20,_double> phi0;
  TPZFNMatrix<20,_double> dphi2;
  TPZFNMatrix<20,_double> dphi1;
  TPZFNMatrix<20,_double> dphi0;
  TPZFMatrix<double> local_780;
  double local_6f0 [21];
  TPZFMatrix<double> local_648;
  double local_5b8 [21];
  TPZFMatrix<double> local_510;
  double local_480 [21];
  TPZFMatrix<double> local_3d8;
  double local_348 [21];
  TPZFMatrix<double> local_2a0;
  double local_210 [21];
  TPZFMatrix<double> local_168;
  double local_d8 [21];
  
  if (2 < order) {
    uVar4 = order - 2;
    uVar7 = (ulong)uVar4;
    local_510.fElem = local_480;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_510.fSize = 0x14;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar7;
    local_510.fGiven = local_510.fElem;
    TPZVec<int>::TPZVec(&local_510.fPivot.super_TPZVec<int>,0);
    local_510.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_510.fPivot.super_TPZVec<int>.fStore = local_510.fPivot.fExtAlloc;
    local_510.fPivot.super_TPZVec<int>.fNElements = 0;
    local_510.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_510.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_510.fWork.fStore = (double *)0x0;
    local_510.fWork.fNElements = 0;
    local_510.fWork.fNAlloc = 0;
    pdVar1 = (double *)0x0;
    if ((uVar4 != 0) && (pdVar1 = local_510.fElem, 0x14 < uVar4)) {
      pdVar1 = (double *)operator_new__(uVar7 * 8);
    }
    local_510.fElem = pdVar1;
    local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_648.fElem = local_5b8;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_648.fSize = 0x14;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar7;
    local_648.fGiven = local_648.fElem;
    TPZVec<int>::TPZVec(&local_648.fPivot.super_TPZVec<int>,0);
    local_648.fPivot.super_TPZVec<int>.fStore = local_648.fPivot.fExtAlloc;
    local_648.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_648.fPivot.super_TPZVec<int>.fNElements = 0;
    local_648.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_648.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_648.fWork.fStore = (double *)0x0;
    local_648.fWork.fNElements = 0;
    local_648.fWork.fNAlloc = 0;
    if (uVar7 == 0) {
      local_648.fElem = (double *)0x0;
    }
    else if (0x14 < uVar4) {
      local_648.fElem = (double *)operator_new__(uVar7 * 8);
    }
    uVar8 = order - 1;
    uVar2 = (ulong)uVar8;
    local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_780.fElem = local_6f0;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_780.fSize = 0x14;
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = uVar2;
    local_780.fGiven = local_780.fElem;
    TPZVec<int>::TPZVec(&local_780.fPivot.super_TPZVec<int>,0);
    local_780.fPivot.super_TPZVec<int>.fStore = local_780.fPivot.fExtAlloc;
    local_780.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_780.fPivot.super_TPZVec<int>.fNElements = 0;
    local_780.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_780.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_780.fWork.fStore = (double *)0x0;
    local_780.fWork.fNElements = 0;
    local_780.fWork.fNAlloc = 0;
    if (uVar8 == 0) {
      local_780.fElem = (double *)0x0;
    }
    else if (0x14 < uVar8) {
      local_780.fElem = (double *)operator_new__(uVar2 * 8);
    }
    local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_168.fElem = local_d8;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_168.fSize = 0x14;
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar7;
    local_168.fGiven = local_168.fElem;
    TPZVec<int>::TPZVec(&local_168.fPivot.super_TPZVec<int>,0);
    local_168.fPivot.super_TPZVec<int>.fStore = local_168.fPivot.fExtAlloc;
    local_168.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_168.fPivot.super_TPZVec<int>.fNElements = 0;
    local_168.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_168.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_168.fWork.fStore = (double *)0x0;
    local_168.fWork.fNElements = 0;
    local_168.fWork.fNAlloc = 0;
    if (uVar7 == 0) {
      local_168.fElem = (double *)0x0;
    }
    else if (0x14 < uVar4) {
      local_168.fElem = (double *)operator_new__(uVar7 * 8);
    }
    local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_2a0.fElem = local_210;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_2a0.fSize = 0x14;
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar7;
    local_2a0.fGiven = local_2a0.fElem;
    TPZVec<int>::TPZVec(&local_2a0.fPivot.super_TPZVec<int>,0);
    local_2a0.fPivot.super_TPZVec<int>.fStore = local_2a0.fPivot.fExtAlloc;
    local_2a0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_2a0.fPivot.super_TPZVec<int>.fNElements = 0;
    local_2a0.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_2a0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_2a0.fWork.fStore = (double *)0x0;
    local_2a0.fWork.fNElements = 0;
    local_2a0.fWork.fNAlloc = 0;
    if (uVar7 == 0) {
      local_2a0.fElem = (double *)0x0;
    }
    else if (0x14 < uVar4) {
      local_2a0.fElem = (double *)operator_new__(uVar7 * 8);
    }
    local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    local_3d8.fElem = local_348;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = 1;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFMatrix_0183e5a0;
    local_3d8.fSize = 0x14;
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = uVar2;
    local_3d8.fGiven = local_3d8.fElem;
    TPZVec<int>::TPZVec(&local_3d8.fPivot.super_TPZVec<int>,0);
    local_3d8.fPivot.super_TPZVec<int>.fStore = local_3d8.fPivot.fExtAlloc;
    local_3d8.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_0183cde8;
    local_3d8.fPivot.super_TPZVec<int>.fNElements = 0;
    local_3d8.fPivot.super_TPZVec<int>.fNAlloc = 0;
    local_3d8.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
    local_3d8.fWork.fStore = (double *)0x0;
    local_3d8.fWork.fNElements = 0;
    local_3d8.fWork.fNAlloc = 0;
    if (uVar8 == 0) {
      local_3d8.fElem = (double *)0x0;
    }
    else if (0x14 < uVar8) {
      local_3d8.fElem = (double *)operator_new__(uVar2 << 3);
    }
    local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
         (_func_int **)&PTR__TPZFNMatrix_0183e2b0;
    (*(code *)TPZShapeLinear::fOrthogonal)
              (*x->fStore + *x->fStore + -1.0,uVar7,&local_510,&local_168);
    (*(code *)TPZShapeLinear::fOrthogonal)
              (x->fStore[1] + x->fStore[1] + -1.0,uVar4,&local_648,&local_2a0);
    (*(code *)TPZShapeLinear::fOrthogonal)(x->fStore[2],uVar2,&local_780,&local_3d8);
    if ((int)uVar8 < 2) {
      uVar2 = 1;
    }
    uVar8 = 1;
    if (1 < (int)uVar4) {
      uVar8 = uVar4;
    }
    uVar7 = 0;
    iVar9 = 0;
    do {
      uVar5 = 0;
      do {
        uVar6 = 0;
        do {
          if ((long)(uVar5 + uVar7) < (long)(int)uVar4) {
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar3 = (long)iVar9;
            if (((iVar9 < 0) || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar3))
               || ((phi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            phi->fElem[lVar3] =
                 local_510.fElem[uVar7] * local_648.fElem[uVar5] * local_780.fElem[uVar6];
            if ((local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar7)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) || (iVar9 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar3)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar3] =
                 (local_168.fElem
                  [local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7] +
                 local_168.fElem[local_168.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar7]
                 ) * local_648.fElem[uVar5] * local_780.fElem[uVar6];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar5)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar6) ||
               (local_780.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) || (iVar9 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar3)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[(dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar3 + 1] =
                 (local_510.fElem[uVar7] + local_510.fElem[uVar7]) *
                 local_2a0.fElem[local_2a0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar5]
                 * local_780.fElem[uVar6];
            if ((local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar7) ||
               (local_510.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow <= (long)uVar5) ||
               (local_648.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol < 1)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow < 1) ||
               (local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol <= (long)uVar6)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 3) || (iVar9 < 0)) ||
               ((dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar3)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            dphi->fElem[lVar3 * (dphi->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow + 2] =
                 local_510.fElem[uVar7] * local_648.fElem[uVar5] *
                 local_3d8.fElem[local_3d8.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow * uVar6]
            ;
            iVar9 = iVar9 + 1;
          }
          uVar6 = uVar6 + 1;
        } while (uVar2 != uVar6);
        uVar5 = uVar5 + 1;
      } while (uVar5 != uVar8);
      uVar7 = uVar7 + 1;
    } while (uVar7 != uVar8);
    TPZFMatrix<double>::~TPZFMatrix(&local_3d8,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_2a0,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_168,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_780,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_648,&PTR_PTR_0183e568);
    TPZFMatrix<double>::~TPZFMatrix(&local_510,&PTR_PTR_0183e568);
  }
  return;
}

Assistant:

void TPZShapePrism::ShapeInternal(TPZVec<REAL> &x, int order,TPZFMatrix<REAL> &phi,
									  TPZFMatrix<REAL> &dphi) {
		//valor da fun��o e derivada do produto das fun��es ortogonais
		if(order < 3) return;
		int ord1 = order-2;
		int ord2 = order-1;
		
		TPZFNMatrix<20,REAL> phi0(ord1,1),phi1(ord1,1),phi2(ord2,1),
		dphi0(1,ord1),dphi1(1,ord1),dphi2(1,ord2);
		TPZShapeLinear::fOrthogonal(2.*x[0]-1.,ord1,phi0,dphi0);//f e df       0<=x0<=1 -> -1<=2*x0-1<=1
		TPZShapeLinear::fOrthogonal(2.*x[1]-1.,ord1,phi1,dphi1);//g e dg             0<=x1<=1 -> -1<=2*x1-1<=1
		TPZShapeLinear::fOrthogonal(x[2],ord2,phi2,dphi2);//h e dh      -1<=x3<=1
		int index = 0;//x � ponto de integra��o dentro da pir�mide
		for (int i=0;i<ord1;i++) {
			for (int j=0;j<ord1;j++) {
				for (int k=0;k<ord2;k++) {
					if( i+j < ord1 && k < ord2) {
						phi(index,0) =     phi0(i,0)* phi1(j,0)* phi2(k,0);
						dphi(0,index) = 2.*dphi0(0,i)* phi1(j,0)* phi2(k,0);
						dphi(1,index) =  2.*phi0(i,0)*dphi1(0,j)* phi2(k,0);
						dphi(2,index) =     phi0(i,0)* phi1(j,0)*dphi2(0,k);
						index++;
					}
				}
			}
		}
	}